

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

float64 vector_sum_norm(float32 *vec,int32 len)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = uVar1;
  }
  dVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + (double)(float)vec[uVar1];
  }
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      vec[uVar1] = (float32)(float)((double)(float)vec[uVar1] * (1.0 / dVar3));
    }
  }
  return (float64)dVar3;
}

Assistant:

float64 vector_sum_norm (float32 *vec, int32 len)
{
    float64 sum, f;
    int32 i;
    
    sum = 0.0;
    for (i = 0; i < len; i++)
	sum += vec[i];

    if (sum != 0.0) {
	f = 1.0 / sum;
	for (i = 0; i < len; i++)
	    vec[i] *= f;
    }
    
    return sum;
}